

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory_basketball_factory.cpp
# Opt level: O3

shared_ptr<factory::Product> __thiscall
factory::BasketballFactory::GetProduct(BasketballFactory *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<factory::Product> sVar1;
  undefined1 local_29;
  IFactory local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  local_28._vptr_IFactory = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<factory::Basketball,std::allocator<factory::Basketball>>
            (a_Stack_20,(Basketball **)&local_28,(allocator<factory::Basketball> *)&local_29);
  (this->super_IFactory)._vptr_IFactory = local_28._vptr_IFactory;
  this[1].super_IFactory._vptr_IFactory = (_func_int **)a_Stack_20[0]._M_pi;
  sVar1.super___shared_ptr<factory::Product,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<factory::Product,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<factory::Product>)
         sVar1.super___shared_ptr<factory::Product,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Product> BasketballFactory::GetProduct() {
    return std::shared_ptr<Product>{std::make_shared<Basketball>()};
}